

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

void __thiscall
bandit::context::bandit::run_all
          (bandit *this,
          list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *funcs)

{
  bool bVar1;
  reference __x;
  undefined1 local_50 [8];
  function<void_()> f;
  const_iterator __end2;
  const_iterator __begin2;
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *__range2;
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *funcs_local;
  bandit *this_local;
  
  __end2 = std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
           begin(funcs);
  f._M_invoker = (_Invoker_type)
                 std::__cxx11::
                 list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::end(funcs);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&f._M_invoker);
    if (!bVar1) break;
    __x = std::_List_const_iterator<std::function<void_()>_>::operator*(&__end2);
    std::function<void_()>::function((function<void_()> *)local_50,__x);
    std::function<void_()>::operator()((function<void_()> *)local_50);
    std::function<void_()>::~function((function<void_()> *)local_50);
    std::_List_const_iterator<std::function<void_()>_>::operator++(&__end2);
  }
  return;
}

Assistant:

void run_all(const std::list<std::function<void()>>& funcs) {
        for (auto f : funcs) {
          f();
        }
      }